

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

bool __thiscall
glcts::UniformBlocksLayoutBindingCase::UniformBlocksLayoutBindingProgram::setBindingPoints
          (UniformBlocksLayoutBindingProgram *this,StringVector *list,GLint bindingPoint)

{
  GLuint GVar1;
  pointer pbVar2;
  bool bVar3;
  
  pbVar2 = (list->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  bVar3 = pbVar2 == (list->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
  if (!bVar3) {
    GVar1 = (*((this->super_LayoutBindingProgram).m_gl)->getUniformBlockIndex)
                      ((((this->super_LayoutBindingProgram).m_program)->m_program).m_program,
                       (pbVar2->_M_dataplus)._M_p);
    while (GVar1 != 0xffffffff) {
      pbVar2 = pbVar2 + 1;
      (*((this->super_LayoutBindingProgram).m_gl)->uniformBlockBinding)
                ((((this->super_LayoutBindingProgram).m_program)->m_program).m_program,GVar1,
                 bindingPoint);
      bVar3 = pbVar2 == (list->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
      if (bVar3) {
        return bVar3;
      }
      GVar1 = (*((this->super_LayoutBindingProgram).m_gl)->getUniformBlockIndex)
                        ((((this->super_LayoutBindingProgram).m_program)->m_program).m_program,
                         (pbVar2->_M_dataplus)._M_p);
    }
  }
  return bVar3;
}

Assistant:

virtual void teardownTest()
	{
		for (Texture2DMap::iterator it = m_textures2D.begin(); it != m_textures2D.end(); it++)
		{
			delete it->second;
		}
		m_textures2D.clear();

		for (Texture2DArrayMap::iterator it = m_textures2DArray.begin(); it != m_textures2DArray.end(); it++)
		{
			delete it->second;
		}
		m_textures2DArray.clear();

		for (Texture3DMap::iterator it = m_textures3D.begin(); it != m_textures3D.end(); it++)
		{
			delete it->second;
		}
		m_textures3D.clear();
	}